

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlCopyChar(int len,xmlChar *out,int val)

{
  int val_local;
  xmlChar *out_local;
  int len_local;
  
  if ((out == (xmlChar *)0x0) || (val < 0)) {
    out_local._4_4_ = 0;
  }
  else if (val < 0x80) {
    *out = (xmlChar)val;
    out_local._4_4_ = 1;
  }
  else {
    out_local._4_4_ = xmlCopyCharMultiByte(out,val);
  }
  return out_local._4_4_;
}

Assistant:

int
xmlCopyChar(int len ATTRIBUTE_UNUSED, xmlChar *out, int val) {
    if ((out == NULL) || (val < 0)) return(0);
    /* the len parameter is ignored */
    if  (val >= 0x80) {
	return(xmlCopyCharMultiByte (out, val));
    }
    *out = val;
    return 1;
}